

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<std::function<void_()>,_0UL>::SmallVector
          (SmallVector<std::function<void_()>,_0UL> *this)

{
  function<void_()> *pfVar1;
  SmallVector<std::function<void_()>,_0UL> *this_local;
  
  VectorView<std::function<void_()>_>::VectorView(&this->super_VectorView<std::function<void_()>_>);
  this->buffer_capacity = 0;
  pfVar1 = AlignedBuffer<std::function<void_()>,_0UL>::data
                     ((AlignedBuffer<std::function<void_()>,_0UL> *)&this->field_0x18);
  (this->super_VectorView<std::function<void_()>_>).ptr = pfVar1;
  this->buffer_capacity = 0;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}